

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O0

string * __thiscall
Dashel::IPV4Address::format_abi_cxx11_
          (string *__return_storage_ptr__,IPV4Address *this,bool resolveName)

{
  in_addr __in;
  hostent *phVar1;
  ostream *poVar2;
  char *pcVar3;
  in_addr addr;
  hostent *he;
  ostringstream local_198 [4];
  uint a2;
  ostringstream buf;
  bool resolveName_local;
  IPV4Address *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  he._4_4_ = htonl(this->address);
  if ((resolveName) &&
     (phVar1 = gethostbyaddr((void *)((long)&he + 4),4,2), phVar1 != (hostent *)0x0)) {
    poVar2 = std::operator<<((ostream *)local_198,"tcp:host=");
    poVar2 = std::operator<<(poVar2,phVar1->h_name);
    poVar2 = std::operator<<(poVar2,";port=");
    std::ostream::operator<<(poVar2,this->port);
    std::__cxx11::ostringstream::str();
  }
  else {
    __in.s_addr = he._4_4_;
    poVar2 = std::operator<<((ostream *)local_198,"tcp:host=");
    pcVar3 = inet_ntoa(__in);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,";port=");
    std::ostream::operator<<(poVar2,this->port);
    std::__cxx11::ostringstream::str();
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string IPV4Address::format(const bool resolveName) const
	{
		std::ostringstream buf;
		unsigned a2 = htonl(address);

		if (resolveName)
		{
			struct hostent* he = gethostbyaddr((const char*)&a2, 4, AF_INET);
			if (he != NULL)
			{
				buf << "tcp:host=" << he->h_name << ";port=" << port;
				return buf.str();
			}
		}

		struct in_addr addr;
		addr.s_addr = a2;
		buf << "tcp:host=" << inet_ntoa(addr) << ";port=" << port;
		return buf.str();
	}